

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Stats *stats)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"cfgs(",5);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,stats->cfgs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"instrs(",7);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,stats->instrs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"blocks(",7);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,stats->blocks);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"phantoms(",9);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,stats->phantoms);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"edges(",6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,stats->edges);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"calls(",6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,stats->calls);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SimpleStrategy::Stats& stats) {
	os << "cfgs(" << stats.cfgs << "), "
		<< "instrs(" << stats.instrs << "), "
		<< "blocks(" << stats.blocks << "), "
		<< "phantoms(" << stats.phantoms << "), "
		<< "edges(" << stats.edges << "), "
		<< "calls(" << stats.calls << ")";
	return os;
}